

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

char * __thiscall spvc_context_s::allocate_name(spvc_context_s *this,string *name)

{
  pointer pcVar1;
  StringAllocation *this_00;
  pointer *__ptr;
  _Head_base<0UL,_StringAllocation_*,_false> local_68 [5];
  string local_40;
  
  this_00 = (StringAllocation *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  StringAllocation::StringAllocation(this_00,&local_40);
  local_68[0]._M_head_impl = this_00;
  std::__cxx11::string::~string((string *)&local_40);
  pcVar1 = (this_00->str)._M_dataplus._M_p;
  spirv_cross::
  SmallVector<std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>,8ul>
  ::emplace_back<std::unique_ptr<StringAllocation,std::default_delete<StringAllocation>>>
            ((SmallVector<std::unique_ptr<ScratchMemoryAllocation,std::default_delete<ScratchMemoryAllocation>>,8ul>
              *)&this->allocations,
             (unique_ptr<StringAllocation,_std::default_delete<StringAllocation>_> *)local_68);
  if (local_68[0]._M_head_impl != (StringAllocation *)0x0) {
    (*((local_68[0]._M_head_impl)->super_ScratchMemoryAllocation)._vptr_ScratchMemoryAllocation[1])
              ();
  }
  return pcVar1;
}

Assistant:

const char *spvc_context_s::allocate_name(const std::string &name)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto alloc = spvc_allocate<StringAllocation>(name);
		auto *ret = alloc->str.c_str();
		allocations.emplace_back(std::move(alloc));
		return ret;
	}